

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O0

void __thiscall
wasm::ReconstructStringifyWalker::transitionToInSkipSeq(ReconstructStringifyWalker *this)

{
  Module *this_00;
  reference pvVar1;
  Function *pFVar2;
  Fatal local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Fatal local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  Err *err;
  char *local_58;
  undefined1 local_50 [8];
  Result<wasm::Ok> _val;
  Function *outlinedFunc;
  ReconstructStringifyWalker *this_local;
  
  this_00 = Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
            ::getModule((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                         *)this);
  pvVar1 = std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::
           operator[](&this->sequences,(ulong)this->seqCounter);
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = (pvVar1->func).super_IString.str._M_len;
  pFVar2 = Module::getFunction(this_00,(Name)(pvVar1->func).super_IString.str);
  err = (Err *)(pFVar2->super_Importable).super_Named.name.super_IString.str._M_len;
  local_58 = (pFVar2->super_Importable).super_Named.name.super_IString.str._M_str;
  IRBuilder::makeCall((Result<wasm::Ok> *)local_50,&this->existingBuilder,
                      (Name)(pFVar2->super_Importable).super_Named.name.super_IString.str,false);
  local_68 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_50)->msg;
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    Fatal::Fatal(&local_1f0);
    Fatal::operator<<(&local_1f0,local_68);
    Fatal::~Fatal(&local_1f0);
  }
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_50);
  pvVar1 = std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::
           operator[](&this->sequences,(ulong)this->seqCounter);
  if ((pvVar1->endsTypeUnreachable & 1U) != 0) {
    IRBuilder::makeUnreachable((Result<wasm::Ok> *)&err_1,&this->existingBuilder);
    local_230 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1)->msg;
    if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      Fatal::Fatal(&local_3b8);
      Fatal::operator<<(&local_3b8,local_230);
      Fatal::~Fatal(&local_3b8);
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
  }
  return;
}

Assistant:

void transitionToInSkipSeq() {
    Function* outlinedFunc =
      getModule()->getFunction(sequences[seqCounter].func);
    ODBG(std::cerr << "\nstarting to skip instructions "
                   << sequences[seqCounter].startIdx << " - "
                   << sequences[seqCounter].endIdx - 1 << " to "
                   << sequences[seqCounter].func
                   << " and adding call() instead\n");
    ASSERT_OK(existingBuilder.makeCall(outlinedFunc->name, false));
    // If the last instruction of the outlined sequence is unreachable, insert
    // an unreachable instruction immediately after the call to the outlined
    // function. This maintains the unreachable type in the original scope
    // of the outlined sequence.
    if (sequences[seqCounter].endsTypeUnreachable) {
      ASSERT_OK(existingBuilder.makeUnreachable());
    }
  }